

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O2

void absl::lts_20250127::StrAppend(Nonnull<std::string_*> dest,AlphaNum *a)

{
  size_t n;
  pointer pcVar1;
  size_t __n;
  ulong uVar2;
  pointer __dest;
  
  n = (a->piece_)._M_len;
  if (n == 0) {
    uVar2 = dest->_M_string_length;
  }
  else {
    uVar2 = dest->_M_string_length;
    if ((ulong)((long)(a->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= uVar2) {
      __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/str_cat.cc"
                    ,0xbb,"void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &)");
    }
  }
  strings_internal::
  AppendUninitializedTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::Append(dest,n);
  pcVar1 = (dest->_M_dataplus)._M_p;
  __dest = pcVar1 + uVar2;
  __n = (a->piece_)._M_len;
  if (__n != 0) {
    memcpy(__dest,(a->piece_)._M_str,__n);
  }
  if (__dest + __n == pcVar1 + dest->_M_string_length) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/str_cat.cc"
                ,0xc1,"void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &)");
}

Assistant:

void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a) {
  ASSERT_NO_OVERLAP(*dest, a);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(dest, a.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  assert(out == begin + dest->size());
}